

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O0

void cm_zlib_inflate_fast(z_streamp strm,uint start)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  internal_state *piVar6;
  uchar *puVar7;
  ulg uVar8;
  Posf *pPVar9;
  int iVar10;
  long lVar11;
  ulg uVar12;
  uchar *puVar13;
  uint uVar14;
  uint uVar15;
  uInt uVar16;
  Bytef *pBVar17;
  Bytef *pBVar18;
  Bytef *pBVar19;
  byte *pbVar20;
  uchar *puVar21;
  uInt local_d0;
  uInt local_c8;
  uchar *local_a8;
  uchar *from;
  uint local_98;
  uint dist;
  uint len;
  uint op;
  code *here;
  uint dmask;
  uint lmask;
  code *dcode;
  code *lcode;
  ulong uStack_68;
  uint bits;
  unsigned_long hold;
  uchar *window;
  uint wnext;
  uint whave;
  uint wsize;
  uchar *end;
  uchar *beg;
  uchar *out;
  uchar *last;
  uchar *in;
  inflate_state *state;
  uint start_local;
  z_streamp strm_local;
  
  piVar6 = strm->state;
  last = strm->next_in;
  pBVar17 = last + (strm->avail_in - 5);
  beg = strm->next_out;
  uVar16 = strm->avail_out;
  iVar10 = (int)beg;
  pBVar18 = beg + (strm->avail_out - 0x101);
  iVar2 = *(int *)((long)&piVar6->gzhead + 4);
  uVar12 = piVar6->gzindex;
  uVar3 = *(uint *)((long)&piVar6->gzindex + 4);
  puVar7 = *(uchar **)&piVar6->method;
  uStack_68._0_4_ = piVar6->w_size;
  uStack_68._4_4_ = piVar6->w_bits;
  lcode._4_4_ = piVar6->w_mask;
  uVar8 = piVar6->window_size;
  pPVar9 = piVar6->prev;
  uVar4 = *(undefined4 *)&piVar6->head;
  uVar5 = *(undefined4 *)((long)&piVar6->head + 4);
LAB_00d9a4d1:
  if (lcode._4_4_ < 0xf) {
    pbVar20 = last + 1;
    bVar1 = *last;
    last = last + 2;
    uStack_68 = ((ulong)*pbVar20 << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                ((ulong)bVar1 << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
    lcode._4_4_ = lcode._4_4_ + 0x10;
  }
  _len = (Posf *)(uVar8 + (uStack_68 & (1 << ((byte)uVar4 & 0x1f)) - 1) * 4);
  while( true ) {
    uStack_68 = uStack_68 >> (*(byte *)((long)_len + 1) & 0x3f);
    lcode._4_4_ = lcode._4_4_ - *(byte *)((long)_len + 1);
    bVar1 = *(byte *)_len;
    if (bVar1 == 0) break;
    if ((bVar1 & 0x10) != 0) {
      local_98 = (uint)*(ushort *)((long)_len + 2);
      uVar14 = bVar1 & 0xf;
      if ((bVar1 & 0xf) != 0) {
        if (lcode._4_4_ < uVar14) {
          uStack_68 = ((ulong)*last << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
          lcode._4_4_ = lcode._4_4_ + 8;
          last = last + 1;
        }
        local_98 = ((uint)uStack_68 & (1 << (sbyte)uVar14) - 1U) + local_98;
        uStack_68 = uStack_68 >> (sbyte)uVar14;
        lcode._4_4_ = lcode._4_4_ - uVar14;
      }
      if (lcode._4_4_ < 0xf) {
        pbVar20 = last + 1;
        bVar1 = *last;
        last = last + 2;
        uStack_68 = ((ulong)*pbVar20 << ((byte)lcode._4_4_ + 8 & 0x3f)) +
                    ((ulong)bVar1 << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
        lcode._4_4_ = lcode._4_4_ + 0x10;
      }
      lVar11 = (uStack_68 & (1 << ((byte)uVar5 & 0x1f)) - 1) * 2;
      goto LAB_00d9a6db;
    }
    if ((bVar1 & 0x40) != 0) {
      if ((bVar1 & 0x20) == 0) {
        strm->msg = "invalid literal/length code";
        piVar6->status = 0x3f51;
      }
      else {
        piVar6->status = 0x3f3f;
      }
      goto LAB_00d9ae56;
    }
    _len = (Posf *)(uVar8 + (long)(int)(uint)*(ushort *)((long)_len + 2) * 4 +
                   (uStack_68 & (1 << (bVar1 & 0x1f)) - 1) * 4);
  }
  *beg = (uchar)*(undefined2 *)((long)_len + 2);
  puVar21 = beg + 1;
  goto LAB_00d9ae23;
LAB_00d9a6db:
  _len = pPVar9 + lVar11;
  uStack_68 = uStack_68 >> (*(byte *)((long)_len + 1) & 0x3f);
  uVar14 = lcode._4_4_ - *(byte *)((long)_len + 1);
  bVar1 = (byte)*_len;
  lcode._4_4_ = uVar14;
  if ((bVar1 & 0x10) != 0) goto code_r0x00d9a72f;
  if ((bVar1 & 0x40) != 0) {
    strm->msg = "invalid distance code";
    piVar6->status = 0x3f51;
    goto LAB_00d9ae56;
  }
  lVar11 = (long)(int)(uint)_len[1] * 2 + (uStack_68 & (1 << (bVar1 & 0x1f)) - 1) * 2;
  goto LAB_00d9a6db;
code_r0x00d9a72f:
  uVar15 = bVar1 & 0xf;
  pbVar20 = last;
  if (uVar14 < uVar15) {
    uStack_68 = ((ulong)*last << ((byte)uVar14 & 0x3f)) + uStack_68;
    lcode._4_4_ = uVar14 + 8;
    pbVar20 = last + 1;
    if (lcode._4_4_ < uVar15) {
      uStack_68 = ((ulong)last[1] << ((byte)lcode._4_4_ & 0x3f)) + uStack_68;
      lcode._4_4_ = uVar14 + 0x10;
      pbVar20 = last + 2;
    }
  }
  last = pbVar20;
  uVar14 = ((uint)uStack_68 & (1 << (sbyte)uVar15) - 1U) + (uint)_len[1];
  uStack_68 = uStack_68 >> (sbyte)uVar15;
  lcode._4_4_ = lcode._4_4_ - uVar15;
  uVar15 = (int)beg - (iVar10 - (start - uVar16));
  if (uVar15 < uVar14) {
    dist = uVar14 - uVar15;
    if (((uint)uVar12 < dist) && (piVar6[1].dyn_ltree[0xf5] != (ct_data_s)0x0)) {
      strm->msg = "invalid distance too far back";
      piVar6->status = 0x3f51;
      goto LAB_00d9ae56;
    }
    if (uVar3 == 0) {
      local_a8 = puVar7 + (iVar2 - dist);
      if (dist < local_98) {
        local_98 = local_98 - dist;
        do {
          puVar21 = beg + 1;
          *beg = *local_a8;
          dist = dist - 1;
          local_a8 = local_a8 + 1;
          beg = puVar21;
        } while (dist != 0);
        local_a8 = puVar21 + -(ulong)uVar14;
      }
    }
    else if (uVar3 < dist) {
      uVar15 = (iVar2 + uVar3) - dist;
      dist = dist - uVar3;
      local_a8 = puVar7 + uVar15;
      if (dist < local_98) {
        local_98 = local_98 - dist;
        do {
          puVar21 = beg + 1;
          *beg = *local_a8;
          dist = dist - 1;
          local_a8 = local_a8 + 1;
          beg = puVar21;
        } while (dist != 0);
        local_a8 = puVar7;
        if (uVar3 < local_98) {
          local_98 = local_98 - uVar3;
          dist = uVar3;
          do {
            puVar21 = beg + 1;
            *beg = *local_a8;
            dist = dist - 1;
            local_a8 = local_a8 + 1;
            beg = puVar21;
          } while (dist != 0);
          local_a8 = puVar21 + -(ulong)uVar14;
        }
      }
    }
    else {
      local_a8 = puVar7 + (uVar3 - dist);
      if (dist < local_98) {
        local_98 = local_98 - dist;
        do {
          puVar21 = beg + 1;
          *beg = *local_a8;
          dist = dist - 1;
          local_a8 = local_a8 + 1;
          beg = puVar21;
        } while (dist != 0);
        local_a8 = puVar21 + -(ulong)uVar14;
      }
    }
    for (; 2 < local_98; local_98 = local_98 - 3) {
      *beg = *local_a8;
      beg[1] = local_a8[1];
      beg[2] = local_a8[2];
      local_a8 = local_a8 + 3;
      beg = beg + 3;
    }
    puVar21 = beg;
    if (local_98 != 0) {
      *beg = *local_a8;
      puVar21 = beg + 1;
      if (1 < local_98) {
        beg[1] = local_a8[1];
        puVar21 = beg + 2;
      }
    }
  }
  else {
    puVar13 = beg + -(ulong)uVar14;
    puVar21 = beg;
    do {
      beg = puVar21;
      local_a8 = puVar13;
      *beg = *local_a8;
      beg[1] = local_a8[1];
      puVar21 = beg + 3;
      beg[2] = local_a8[2];
      local_98 = local_98 - 3;
      puVar13 = local_a8 + 3;
    } while (2 < local_98);
    if (local_98 != 0) {
      *puVar21 = local_a8[3];
      puVar21 = beg + 4;
      if (1 < local_98) {
        beg[4] = local_a8[4];
        puVar21 = beg + 5;
      }
    }
  }
LAB_00d9ae23:
  beg = puVar21;
  if (pBVar17 <= last || pBVar18 <= beg) {
LAB_00d9ae56:
    pBVar19 = last + -(ulong)(lcode._4_4_ >> 3);
    uVar16 = lcode._4_4_ + (lcode._4_4_ >> 3) * -8;
    uStack_68 = (1 << ((byte)uVar16 & 0x1f)) - 1 & uStack_68;
    strm->next_in = pBVar19;
    strm->next_out = beg;
    if (pBVar19 < pBVar17) {
      iVar2 = (int)pBVar17 - (int)pBVar19;
    }
    else {
      iVar2 = -((int)pBVar19 - (int)pBVar17);
    }
    local_c8 = iVar2 + 5;
    strm->avail_in = local_c8;
    if (beg < pBVar18) {
      iVar2 = (int)pBVar18 - (int)beg;
    }
    else {
      iVar2 = -((int)beg - (int)pBVar18);
    }
    local_d0 = iVar2 + 0x101;
    strm->avail_out = local_d0;
    piVar6->w_size = (int)uStack_68;
    piVar6->w_bits = (int)(uStack_68 >> 0x20);
    piVar6->w_mask = uVar16;
    return;
  }
  goto LAB_00d9a4d1;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code const *here;           /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - 5);
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode + (hold & lmask);
      dolen:
        op = (unsigned)(here->bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here->op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here->val >= 0x20 && here->val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here->val));
            *out++ = (unsigned char)(here->val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here->val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode + (hold & dmask);
          dodist:
            op = (unsigned)(here->bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here->op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here->val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode + here->val + (hold & ((1U << op) - 1));
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode + here->val + (hold & ((1U << op) - 1));
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}